

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.h
# Opt level: O1

void __thiscall Assimp::AC3DImporter::Object::Object(Object *this)

{
  char *__end;
  
  this->type = World;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->name,"","");
  (this->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->texture)._M_dataplus._M_p = (pointer)&(this->texture).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->texture,"","");
  (this->texRepeat).x = 1.0;
  (this->texRepeat).y = 1.0;
  (this->texOffset).x = 0.0;
  (this->texOffset).y = 0.0;
  (this->rotation).a1 = 1.0;
  (this->rotation).a2 = 0.0;
  (this->rotation).a3 = 0.0;
  (this->rotation).b1 = 0.0;
  (this->rotation).b2 = 1.0;
  (this->rotation).b3 = 0.0;
  (this->rotation).c1 = 0.0;
  (this->rotation).c2 = 0.0;
  (this->rotation).c3 = 1.0;
  (this->translation).x = 0.0;
  (this->translation).y = 0.0;
  *(undefined8 *)&(this->translation).z = 0;
  *(undefined8 *)
   ((long)&(this->vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->vertices).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->surfaces).
           super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->surfaces).
           super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->surfaces).
           super__Vector_base<Assimp::AC3DImporter::Surface,_std::allocator<Assimp::AC3DImporter::Surface>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  this->subDiv = 0;
  this->crease = 0.0;
  return;
}

Assistant:

Object()
            :   type    (World)
            ,   name( "" )
            ,   children()
            ,   texture( "" )
            ,   texRepeat( 1.f, 1.f )
            ,   texOffset( 0.0f, 0.0f )
            ,   rotation()
            ,   translation()
            ,   vertices()
            ,   surfaces()
            ,   numRefs (0)
            ,   subDiv  (0)
            ,   crease()
        {}